

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixVector.h
# Opt level: O3

void Eigen::internal::
     general_matrix_vector_product<long,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_1>,_1,_false,_float,_Eigen::internal::const_blas_data_mapper<float,_long,_0>,_false,_0>
     ::run(long rows,long cols,const_blas_data_mapper<float,_long,_1> *alhs,
          const_blas_data_mapper<float,_long,_0> *rhs,ResScalar *res,long resIncr,ResScalar alpha)

{
  float *pfVar1;
  long lVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  long lVar10;
  long lVar11;
  float *pfVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  float *pfVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float *local_f0;
  float *local_e8;
  float *local_e0;
  float *local_d8;
  float *local_90;
  float *local_88;
  
  pfVar8 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_data;
  lVar2 = (alhs->super_blas_data_mapper<const_float,_long,_1,_0,_1>).m_stride;
  if (rows < 8 || 32000 < (ulong)(lVar2 * 4)) {
    uVar13 = 0;
  }
  else {
    pfVar14 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar12 = pfVar8 + lVar2 * 7;
    local_d8 = pfVar8 + lVar2 * 6;
    local_e0 = pfVar8 + lVar2 * 5;
    local_e8 = pfVar8 + lVar2 * 4;
    local_f0 = pfVar8 + lVar2 * 3;
    local_88 = pfVar8 + lVar2 * 2;
    local_90 = pfVar8 + lVar2;
    uVar13 = 0;
    pfVar9 = pfVar8;
    do {
      if (cols < 4) {
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar17 = 0.0;
        fVar18 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        lVar10 = 0;
      }
      else {
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar45 = 0.0;
        fVar46 = 0.0;
        fVar47 = 0.0;
        fVar48 = 0.0;
        fVar41 = 0.0;
        fVar42 = 0.0;
        fVar43 = 0.0;
        fVar44 = 0.0;
        fVar37 = 0.0;
        fVar38 = 0.0;
        fVar39 = 0.0;
        fVar40 = 0.0;
        fVar17 = 0.0;
        fVar18 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar33 = 0.0;
        fVar34 = 0.0;
        fVar35 = 0.0;
        fVar36 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        lVar15 = 0;
        do {
          pfVar16 = pfVar14 + lVar15;
          fVar3 = *pfVar16;
          fVar4 = pfVar16[1];
          fVar5 = pfVar16[2];
          fVar6 = pfVar16[3];
          pfVar16 = pfVar9 + lVar15;
          fVar21 = fVar21 + *pfVar16 * fVar3;
          fVar22 = fVar22 + pfVar16[1] * fVar4;
          fVar23 = fVar23 + pfVar16[2] * fVar5;
          fVar24 = fVar24 + pfVar16[3] * fVar6;
          pfVar16 = pfVar9 + lVar15 + lVar2;
          fVar45 = fVar45 + *pfVar16 * fVar3;
          fVar46 = fVar46 + pfVar16[1] * fVar4;
          fVar47 = fVar47 + pfVar16[2] * fVar5;
          fVar48 = fVar48 + pfVar16[3] * fVar6;
          pfVar16 = pfVar9 + lVar15 + lVar2 * 2;
          fVar41 = fVar41 + *pfVar16 * fVar3;
          fVar42 = fVar42 + pfVar16[1] * fVar4;
          fVar43 = fVar43 + pfVar16[2] * fVar5;
          fVar44 = fVar44 + pfVar16[3] * fVar6;
          pfVar16 = pfVar9 + lVar15 + lVar2 * 3;
          fVar37 = fVar37 + *pfVar16 * fVar3;
          fVar38 = fVar38 + pfVar16[1] * fVar4;
          fVar39 = fVar39 + pfVar16[2] * fVar5;
          fVar40 = fVar40 + pfVar16[3] * fVar6;
          pfVar16 = pfVar9 + lVar15 + lVar2 * 4;
          fVar17 = fVar17 + *pfVar16 * fVar3;
          fVar18 = fVar18 + pfVar16[1] * fVar4;
          fVar19 = fVar19 + pfVar16[2] * fVar5;
          fVar20 = fVar20 + pfVar16[3] * fVar6;
          pfVar16 = pfVar9 + lVar15 + lVar2 * 5;
          fVar33 = fVar33 + *pfVar16 * fVar3;
          fVar34 = fVar34 + pfVar16[1] * fVar4;
          fVar35 = fVar35 + pfVar16[2] * fVar5;
          fVar36 = fVar36 + pfVar16[3] * fVar6;
          pfVar16 = pfVar9 + lVar15 + lVar2 * 6;
          pfVar7 = pfVar9 + lVar15 + lVar2 * 7;
          fVar29 = fVar29 + *pfVar16 * fVar3;
          fVar30 = fVar30 + pfVar16[1] * fVar4;
          fVar31 = fVar31 + pfVar16[2] * fVar5;
          fVar32 = fVar32 + pfVar16[3] * fVar6;
          fVar25 = fVar25 + *pfVar7 * fVar3;
          fVar26 = fVar26 + pfVar7[1] * fVar4;
          fVar27 = fVar27 + pfVar7[2] * fVar5;
          fVar28 = fVar28 + pfVar7[3] * fVar6;
          lVar10 = lVar15 + 4;
          lVar11 = lVar15 + 8;
          lVar15 = lVar10;
        } while (lVar11 <= cols);
      }
      fVar21 = fVar24 + fVar22 + fVar23 + fVar21;
      fVar22 = fVar48 + fVar46 + fVar47 + fVar45;
      fVar23 = fVar44 + fVar42 + fVar43 + fVar41;
      fVar24 = fVar40 + fVar38 + fVar39 + fVar37;
      fVar17 = fVar20 + fVar18 + fVar19 + fVar17;
      fVar18 = fVar36 + fVar34 + fVar35 + fVar33;
      fVar19 = fVar32 + fVar30 + fVar31 + fVar29;
      fVar20 = fVar28 + fVar26 + fVar27 + fVar25;
      if (lVar10 < cols) {
        lVar15 = 0;
        do {
          fVar25 = pfVar14[lVar10 + lVar15];
          fVar21 = fVar21 + pfVar9[lVar10 + lVar15] * fVar25;
          fVar22 = fVar22 + local_90[lVar10 + lVar15] * fVar25;
          fVar23 = fVar23 + local_88[lVar10 + lVar15] * fVar25;
          fVar24 = fVar24 + local_f0[lVar10 + lVar15] * fVar25;
          fVar17 = fVar17 + local_e8[lVar10 + lVar15] * fVar25;
          fVar18 = fVar18 + local_e0[lVar10 + lVar15] * fVar25;
          fVar19 = fVar19 + local_d8[lVar10 + lVar15] * fVar25;
          fVar20 = fVar20 + pfVar12[lVar10 + lVar15] * fVar25;
          lVar15 = lVar15 + 1;
        } while (cols - lVar10 != lVar15);
      }
      res[uVar13 * resIncr] = alpha * fVar21 + res[uVar13 * resIncr];
      lVar15 = (uVar13 | 1) * resIncr;
      res[lVar15] = fVar22 * alpha + res[lVar15];
      lVar15 = (uVar13 | 2) * resIncr;
      res[lVar15] = fVar23 * alpha + res[lVar15];
      lVar15 = (uVar13 | 3) * resIncr;
      res[lVar15] = fVar24 * alpha + res[lVar15];
      lVar15 = (uVar13 | 4) * resIncr;
      res[lVar15] = alpha * fVar17 + res[lVar15];
      lVar15 = (uVar13 | 5) * resIncr;
      res[lVar15] = fVar18 * alpha + res[lVar15];
      lVar15 = (uVar13 | 6) * resIncr;
      res[lVar15] = fVar19 * alpha + res[lVar15];
      lVar15 = (uVar13 | 7) * resIncr;
      res[lVar15] = fVar20 * alpha + res[lVar15];
      uVar13 = uVar13 + 8;
      pfVar9 = pfVar9 + lVar2 * 8;
      pfVar12 = pfVar12 + lVar2 * 8;
      local_d8 = local_d8 + lVar2 * 8;
      local_e0 = local_e0 + lVar2 * 8;
      local_e8 = local_e8 + lVar2 * 8;
      local_f0 = local_f0 + lVar2 * 8;
      local_88 = local_88 + lVar2 * 8;
      local_90 = local_90 + lVar2 * 8;
    } while ((long)uVar13 < rows + -7);
  }
  if ((long)uVar13 < rows + -3) {
    pfVar7 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar14 = pfVar8 + uVar13 * lVar2;
    pfVar9 = pfVar8 + (uVar13 + 1) * lVar2;
    pfVar12 = pfVar8 + (uVar13 + 2) * lVar2;
    pfVar16 = pfVar8 + (uVar13 + 3) * lVar2;
    do {
      if (cols < 4) {
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar17 = 0.0;
        fVar18 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        lVar10 = 0;
      }
      else {
        fVar17 = 0.0;
        fVar18 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar29 = 0.0;
        fVar30 = 0.0;
        fVar31 = 0.0;
        fVar32 = 0.0;
        fVar25 = 0.0;
        fVar26 = 0.0;
        fVar27 = 0.0;
        fVar28 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        lVar15 = 0;
        do {
          pfVar1 = pfVar7 + lVar15;
          fVar33 = *pfVar1;
          fVar34 = pfVar1[1];
          fVar35 = pfVar1[2];
          fVar36 = pfVar1[3];
          pfVar1 = pfVar14 + lVar15;
          fVar17 = fVar17 + *pfVar1 * fVar33;
          fVar18 = fVar18 + pfVar1[1] * fVar34;
          fVar19 = fVar19 + pfVar1[2] * fVar35;
          fVar20 = fVar20 + pfVar1[3] * fVar36;
          pfVar1 = pfVar9 + lVar15;
          fVar29 = fVar29 + *pfVar1 * fVar33;
          fVar30 = fVar30 + pfVar1[1] * fVar34;
          fVar31 = fVar31 + pfVar1[2] * fVar35;
          fVar32 = fVar32 + pfVar1[3] * fVar36;
          pfVar1 = pfVar12 + lVar15;
          fVar25 = fVar25 + *pfVar1 * fVar33;
          fVar26 = fVar26 + pfVar1[1] * fVar34;
          fVar27 = fVar27 + pfVar1[2] * fVar35;
          fVar28 = fVar28 + pfVar1[3] * fVar36;
          pfVar1 = pfVar16 + lVar15;
          fVar21 = fVar21 + *pfVar1 * fVar33;
          fVar22 = fVar22 + pfVar1[1] * fVar34;
          fVar23 = fVar23 + pfVar1[2] * fVar35;
          fVar24 = fVar24 + pfVar1[3] * fVar36;
          lVar10 = lVar15 + 4;
          lVar11 = lVar15 + 8;
          lVar15 = lVar10;
        } while (lVar11 <= cols);
      }
      fVar17 = fVar20 + fVar18 + fVar19 + fVar17;
      fVar18 = fVar32 + fVar30 + fVar31 + fVar29;
      fVar19 = fVar28 + fVar26 + fVar27 + fVar25;
      fVar20 = fVar24 + fVar22 + fVar23 + fVar21;
      if (lVar10 < cols) {
        lVar15 = 0;
        do {
          fVar21 = pfVar7[lVar10 + lVar15];
          fVar17 = fVar17 + pfVar14[lVar10 + lVar15] * fVar21;
          fVar18 = fVar18 + pfVar9[lVar10 + lVar15] * fVar21;
          fVar19 = fVar19 + pfVar12[lVar10 + lVar15] * fVar21;
          fVar20 = fVar20 + pfVar16[lVar10 + lVar15] * fVar21;
          lVar15 = lVar15 + 1;
        } while (cols - lVar10 != lVar15);
      }
      res[uVar13 * resIncr] = alpha * fVar17 + res[uVar13 * resIncr];
      lVar15 = (uVar13 + 1) * resIncr;
      res[lVar15] = fVar18 * alpha + res[lVar15];
      lVar15 = (uVar13 + 2) * resIncr;
      res[lVar15] = fVar19 * alpha + res[lVar15];
      lVar15 = (uVar13 + 3) * resIncr;
      res[lVar15] = fVar20 * alpha + res[lVar15];
      uVar13 = uVar13 + 4;
      pfVar14 = pfVar14 + lVar2 * 4;
      pfVar9 = pfVar9 + lVar2 * 4;
      pfVar12 = pfVar12 + lVar2 * 4;
      pfVar16 = pfVar16 + lVar2 * 4;
    } while ((long)uVar13 < rows + -3);
  }
  if ((long)uVar13 < rows + -1) {
    pfVar12 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar14 = pfVar8 + uVar13 * lVar2;
    pfVar9 = pfVar8 + (uVar13 + 1) * lVar2;
    do {
      if (cols < 4) {
        fVar17 = 0.0;
        fVar18 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        lVar10 = 0;
      }
      else {
        fVar21 = 0.0;
        fVar22 = 0.0;
        fVar23 = 0.0;
        fVar24 = 0.0;
        fVar17 = 0.0;
        fVar18 = 0.0;
        fVar19 = 0.0;
        fVar20 = 0.0;
        lVar15 = 0;
        do {
          pfVar16 = pfVar12 + lVar15;
          pfVar7 = pfVar14 + lVar15;
          fVar17 = fVar17 + *pfVar7 * *pfVar16;
          fVar18 = fVar18 + pfVar7[1] * pfVar16[1];
          fVar19 = fVar19 + pfVar7[2] * pfVar16[2];
          fVar20 = fVar20 + pfVar7[3] * pfVar16[3];
          pfVar7 = pfVar9 + lVar15;
          fVar21 = fVar21 + *pfVar7 * *pfVar16;
          fVar22 = fVar22 + pfVar7[1] * pfVar16[1];
          fVar23 = fVar23 + pfVar7[2] * pfVar16[2];
          fVar24 = fVar24 + pfVar7[3] * pfVar16[3];
          lVar10 = lVar15 + 4;
          lVar11 = lVar15 + 8;
          lVar15 = lVar10;
        } while (lVar11 <= cols);
      }
      fVar17 = fVar20 + fVar18 + fVar19 + fVar17;
      fVar18 = fVar24 + fVar22 + fVar23 + fVar21;
      if (lVar10 < cols) {
        do {
          fVar19 = pfVar12[lVar10];
          fVar17 = fVar17 + pfVar14[lVar10] * fVar19;
          fVar18 = fVar18 + pfVar9[lVar10] * fVar19;
          lVar10 = lVar10 + 1;
        } while (cols != lVar10);
      }
      res[uVar13 * resIncr] = alpha * fVar17 + res[uVar13 * resIncr];
      lVar15 = (uVar13 + 1) * resIncr;
      res[lVar15] = fVar18 * alpha + res[lVar15];
      uVar13 = uVar13 + 2;
      pfVar14 = pfVar14 + lVar2 * 2;
      pfVar9 = pfVar9 + lVar2 * 2;
    } while ((long)uVar13 < rows + -1);
  }
  if ((long)uVar13 < rows) {
    pfVar14 = (rhs->super_blas_data_mapper<const_float,_long,_0,_0,_1>).m_data;
    pfVar8 = pfVar8 + lVar2 * uVar13;
    do {
      fVar17 = 0.0;
      fVar19 = 0.0;
      fVar18 = 0.0;
      fVar20 = 0.0;
      if (cols < 4) {
        lVar10 = 0;
        fVar17 = 0.0;
        fVar18 = 0.0;
      }
      else {
        lVar15 = 0;
        do {
          pfVar9 = pfVar14 + lVar15;
          pfVar12 = pfVar8 + lVar15;
          fVar17 = fVar17 + *pfVar12 * *pfVar9;
          fVar19 = fVar19 + pfVar12[1] * pfVar9[1];
          fVar18 = fVar18 + pfVar12[2] * pfVar9[2];
          fVar20 = fVar20 + pfVar12[3] * pfVar9[3];
          lVar10 = lVar15 + 4;
          lVar11 = lVar15 + 8;
          lVar15 = lVar10;
        } while (lVar11 <= cols);
      }
      fVar17 = fVar20 + fVar19 + fVar18 + fVar17;
      if (lVar10 < cols) {
        do {
          fVar17 = fVar17 + pfVar8[lVar10] * pfVar14[lVar10];
          lVar10 = lVar10 + 1;
        } while (cols != lVar10);
      }
      res[uVar13 * resIncr] = fVar17 * alpha + res[uVar13 * resIncr];
      uVar13 = uVar13 + 1;
      pfVar8 = pfVar8 + lVar2;
    } while (uVar13 != rows);
  }
  return;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_DONT_INLINE void general_matrix_vector_product<Index,LhsScalar,LhsMapper,RowMajor,ConjugateLhs,RhsScalar,RhsMapper,ConjugateRhs,Version>::run(
  Index rows, Index cols,
  const LhsMapper& alhs,
  const RhsMapper& rhs,
  ResScalar* res, Index resIncr,
  ResScalar alpha)
{
  // The following copy tells the compiler that lhs's attributes are not modified outside this function
  // This helps GCC to generate propoer code.
  LhsMapper lhs(alhs);

  eigen_internal_assert(rhs.stride()==1);
  conj_helper<LhsScalar,RhsScalar,ConjugateLhs,ConjugateRhs> cj;
  conj_helper<LhsPacket,RhsPacket,ConjugateLhs,ConjugateRhs> pcj;
  conj_helper<LhsPacketHalf,RhsPacketHalf,ConjugateLhs,ConjugateRhs> pcj_half;
  conj_helper<LhsPacketQuarter,RhsPacketQuarter,ConjugateLhs,ConjugateRhs> pcj_quarter;

  // TODO: fine tune the following heuristic. The rationale is that if the matrix is very large,
  //       processing 8 rows at once might be counter productive wrt cache.
  const Index n8 = lhs.stride()*sizeof(LhsScalar)>32000 ? 0 : rows-7;
  const Index n4 = rows-3;
  const Index n2 = rows-1;

  // TODO: for padded aligned inputs, we could enable aligned reads
  enum { LhsAlignment = Unaligned,
         ResPacketSize = Traits::ResPacketSize,
         ResPacketSizeHalf = HalfTraits::ResPacketSize,
         ResPacketSizeQuarter = QuarterTraits::ResPacketSize,
         LhsPacketSize = Traits::LhsPacketSize,
         LhsPacketSizeHalf = HalfTraits::LhsPacketSize,
         LhsPacketSizeQuarter = QuarterTraits::LhsPacketSize,
         HasHalf = (int)ResPacketSizeHalf < (int)ResPacketSize,
         HasQuarter = (int)ResPacketSizeQuarter < (int)ResPacketSizeHalf
  };

  Index i=0;
  for(; i<n8; i+=8)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0)),
              c4 = pset1<ResPacket>(ResScalar(0)),
              c5 = pset1<ResPacket>(ResScalar(0)),
              c6 = pset1<ResPacket>(ResScalar(0)),
              c7 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
      c4 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+4,j),b0,c4);
      c5 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+5,j),b0,c5);
      c6 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+6,j),b0,c6);
      c7 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+7,j),b0,c7);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    ResScalar cc4 = predux(c4);
    ResScalar cc5 = predux(c5);
    ResScalar cc6 = predux(c6);
    ResScalar cc7 = predux(c7);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
      cc4 += cj.pmul(lhs(i+4,j), b0);
      cc5 += cj.pmul(lhs(i+5,j), b0);
      cc6 += cj.pmul(lhs(i+6,j), b0);
      cc7 += cj.pmul(lhs(i+7,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
    res[(i+4)*resIncr] += alpha*cc4;
    res[(i+5)*resIncr] += alpha*cc5;
    res[(i+6)*resIncr] += alpha*cc6;
    res[(i+7)*resIncr] += alpha*cc7;
  }
  for(; i<n4; i+=4)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0)),
              c2 = pset1<ResPacket>(ResScalar(0)),
              c3 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
      c2 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+2,j),b0,c2);
      c3 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+3,j),b0,c3);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    ResScalar cc2 = predux(c2);
    ResScalar cc3 = predux(c3);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
      cc2 += cj.pmul(lhs(i+2,j), b0);
      cc3 += cj.pmul(lhs(i+3,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
    res[(i+2)*resIncr] += alpha*cc2;
    res[(i+3)*resIncr] += alpha*cc3;
  }
  for(; i<n2; i+=2)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0)),
              c1 = pset1<ResPacket>(ResScalar(0));

    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket, Unaligned>(j,0);

      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+0,j),b0,c0);
      c1 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i+1,j),b0,c1);
    }
    ResScalar cc0 = predux(c0);
    ResScalar cc1 = predux(c1);
    for(; j<cols; ++j)
    {
      RhsScalar b0 = rhs(j,0);

      cc0 += cj.pmul(lhs(i+0,j), b0);
      cc1 += cj.pmul(lhs(i+1,j), b0);
    }
    res[(i+0)*resIncr] += alpha*cc0;
    res[(i+1)*resIncr] += alpha*cc1;
  }
  for(; i<rows; ++i)
  {
    ResPacket c0 = pset1<ResPacket>(ResScalar(0));
    ResPacketHalf c0_h = pset1<ResPacketHalf>(ResScalar(0));
    ResPacketQuarter c0_q = pset1<ResPacketQuarter>(ResScalar(0));
    Index j=0;
    for(; j+LhsPacketSize<=cols; j+=LhsPacketSize)
    {
      RhsPacket b0 = rhs.template load<RhsPacket,Unaligned>(j,0);
      c0 = pcj.pmadd(lhs.template load<LhsPacket,LhsAlignment>(i,j),b0,c0);
    }
    ResScalar cc0 = predux(c0);
    if (HasHalf) {
      for(; j+LhsPacketSizeHalf<=cols; j+=LhsPacketSizeHalf)
        {
          RhsPacketHalf b0 = rhs.template load<RhsPacketHalf,Unaligned>(j,0);
          c0_h = pcj_half.pmadd(lhs.template load<LhsPacketHalf,LhsAlignment>(i,j),b0,c0_h);
        }
      cc0 += predux(c0_h);
    }
    if (HasQuarter) {
      for(; j+LhsPacketSizeQuarter<=cols; j+=LhsPacketSizeQuarter)
        {
          RhsPacketQuarter b0 = rhs.template load<RhsPacketQuarter,Unaligned>(j,0);
          c0_q = pcj_quarter.pmadd(lhs.template load<LhsPacketQuarter,LhsAlignment>(i,j),b0,c0_q);
        }
      cc0 += predux(c0_q);
    }
    for(; j<cols; ++j)
    {
      cc0 += cj.pmul(lhs(i,j), rhs(j,0));
    }
    res[i*resIncr] += alpha*cc0;
  }
}